

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coveragetobin.cpp
# Opt level: O3

void coveragetobin::doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  int coverage_id;
  OASIS_FLOAT tiv;
  char line [4096];
  int local_1040;
  undefined1 local_103c [4];
  char local_1038 [4104];
  
  fgets(local_1038,0x1000,_stdin);
  pcVar2 = fgets(local_1038,0x1000,_stdin);
  if (pcVar2 != (char *)0x0) {
    uVar3 = 1;
    iVar4 = 0;
    do {
      iVar1 = __isoc99_sscanf(local_1038,"%d,%f",&local_1040,local_103c);
      if (iVar1 != 2) {
        fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,local_1038);
        return;
      }
      if (iVar4 + 1 != local_1040) {
        doit();
      }
      fwrite(local_103c,4,1,_stdout);
      iVar4 = local_1040;
      uVar3 = uVar3 + 1;
      pcVar2 = fgets(local_1038,0x1000,_stdin);
    } while (pcVar2 != (char *)0x0);
  }
  return;
}

Assistant:

void doit()
	{

		int last_coverage_id = 0;
		char line[4096];
		int lineno = 0;
		fgets(line, sizeof(line), stdin);
		lineno++;

		while (fgets(line, sizeof(line), stdin) != 0)
		{
			int coverage_id;
			OASIS_FLOAT tiv;
			int ret = doscan(line, coverage_id, tiv);
			if (ret != 2) {
				fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
				return;
			}
			else
			{
				if ((last_coverage_id + 1) != coverage_id) {
					fprintf(stderr, "FATAL: Expecting coverage id %d but got %d\n", (last_coverage_id + 1), coverage_id);
					exit(-1);
				}
				fwrite(&tiv, sizeof(tiv), 1, stdout);
				last_coverage_id = coverage_id;
			}
			lineno++;
		}

	}